

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChContactContainerNSC::AddContact
          (ChContactContainerNSC *this,ChCollisionInfo *cinfo,
          shared_ptr<chrono::ChMaterialSurface> *mat1,shared_ptr<chrono::ChMaterialSurface> *mat2)

{
  ChContactable *pCVar1;
  ChContactable *pCVar2;
  ChMaterialCompositionStrategy *strategy;
  int iVar3;
  ChMaterialCompositeNSC cmat;
  shared_ptr<chrono::ChMaterialSurface> sStack_88;
  shared_ptr<chrono::ChMaterialSurface> local_78;
  ChMaterialCompositeNSC local_68;
  
  pCVar1 = cinfo->modelA->mcontactable;
  if (pCVar1 == (ChContactable *)0x0) {
    __assert_fail("cinfo.modelA->GetContactable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerNSC.cpp"
                  ,200,
                  "virtual void chrono::ChContactContainerNSC::AddContact(const collision::ChCollisionInfo &, std::shared_ptr<ChMaterialSurface>, std::shared_ptr<ChMaterialSurface>)"
                 );
  }
  pCVar2 = cinfo->modelB->mcontactable;
  if (pCVar2 != (ChContactable *)0x0) {
    iVar3 = (*pCVar1->_vptr_ChContactable[2])();
    if (((char)iVar3 == '\0') &&
       (iVar3 = (*pCVar2->_vptr_ChContactable[2])(pCVar2), (char)iVar3 == '\0')) {
      return;
    }
    iVar3 = (*((mat1->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_ChMaterialSurface[3])();
    if ((iVar3 == 0) &&
       (iVar3 = (*((mat2->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->_vptr_ChMaterialSurface[3])(), iVar3 == 0)) {
      strategy = (((this->super_ChContactContainer).super_ChPhysicsItem.system)->
                 composition_strategy)._M_t.
                 super___uniq_ptr_impl<chrono::ChMaterialCompositionStrategy,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_chrono::ChMaterialCompositionStrategy_*,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
                 .super__Head_base<0UL,_chrono::ChMaterialCompositionStrategy_*,_false>._M_head_impl
      ;
      std::static_pointer_cast<chrono::ChMaterialSurfaceNSC,chrono::ChMaterialSurface>(&local_78);
      std::static_pointer_cast<chrono::ChMaterialSurfaceNSC,chrono::ChMaterialSurface>(&sStack_88);
      ChMaterialCompositeNSC::ChMaterialCompositeNSC
                (&local_68,strategy,(shared_ptr<chrono::ChMaterialSurfaceNSC> *)&local_78,
                 (shared_ptr<chrono::ChMaterialSurfaceNSC> *)&sStack_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sStack_88.
                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_78.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      InsertContact(this,cinfo,&local_68);
    }
    return;
  }
  __assert_fail("cinfo.modelB->GetContactable()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerNSC.cpp"
                ,0xc9,
                "virtual void chrono::ChContactContainerNSC::AddContact(const collision::ChCollisionInfo &, std::shared_ptr<ChMaterialSurface>, std::shared_ptr<ChMaterialSurface>)"
               );
}

Assistant:

void ChContactContainerNSC::AddContact(const collision::ChCollisionInfo& cinfo,
                                       std::shared_ptr<ChMaterialSurface> mat1,
                                       std::shared_ptr<ChMaterialSurface> mat2) {
    assert(cinfo.modelA->GetContactable());
    assert(cinfo.modelB->GetContactable());

    auto contactableA = cinfo.modelA->GetContactable();
    auto contactableB = cinfo.modelB->GetContactable();

    // Do nothing if any of the contactables is not contact-active
    if (!contactableA->IsContactActive() && !contactableB->IsContactActive())
        return;

    // Check that the two collision models are compatible with penalty contact.
    if (mat1->GetContactMethod() != ChContactMethod::NSC || mat2->GetContactMethod() != ChContactMethod::NSC) {
        return;
    }

    // Create the composite material
    ChMaterialCompositeNSC cmat(GetSystem()->composition_strategy.get(),
                                std::static_pointer_cast<ChMaterialSurfaceNSC>(mat1),
                                std::static_pointer_cast<ChMaterialSurfaceNSC>(mat2));

    InsertContact(cinfo, cmat);
}